

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression cnn::expr::huber_distance(Expression *x,Expression *y,real c)

{
  ComputationGraph *arguments;
  long in_RDX;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_28;
  undefined4 local_24;
  uint *local_20;
  undefined8 local_18;
  
  local_28 = (y->i).t;
  arguments = y->pg;
  local_20 = &local_28;
  local_24 = *(undefined4 *)(in_RDX + 8);
  local_18 = 2;
  ComputationGraph::add_function<cnn::HuberDistance,float&>
            ((ComputationGraph *)&x->i,(initializer_list<cnn::VariableIndex> *)arguments,
             (float *)&local_20);
  x->pg = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)x;
  return EVar1;
}

Assistant:

Expression huber_distance(const Expression& x, const Expression& y, real c) { return Expression(x.pg, x.pg->add_function<HuberDistance>({x.i, y.i}, c)); }